

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O0

void exp_init(rand_gen *gen,param_1 *param)

{
  param_1 *param_local;
  rand_gen *gen_local;
  
  gen->set_avg = exp_set_avg;
  gen->inv_cdf = exp_inv_cdf;
  gen->generate = (_func_double_rand_gen_ptr *)0x0;
  gen->gen_type = 2;
  (*gen->set_avg)(gen,param->a);
  free(param);
  return;
}

Assistant:

static void exp_init(struct rand_gen *gen, struct param_1 *param)
{
	gen->set_avg = exp_set_avg;
	gen->inv_cdf = exp_inv_cdf;
	gen->generate = NULL;
	gen->gen_type = GEN_EXP;

	gen->set_avg(gen, param->a);
	free(param);
}